

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O3

bool __thiscall apngasm::APNGAsm::saveJSON(APNGAsm *this,string *outputPath,string *imageDir)

{
  char cVar1;
  bool bVar2;
  SpecWriter writer;
  SpecWriter SStack_38;
  
  cVar1 = (**(code **)(*(long *)this->_listener + 0x30))();
  if (cVar1 == '\0') {
    bVar2 = false;
  }
  else {
    spec::SpecWriter::SpecWriter(&SStack_38,this,this->_listener);
    bVar2 = spec::SpecWriter::writeJSON(&SStack_38,outputPath,imageDir);
    if (bVar2) {
      (**(code **)(*(long *)this->_listener + 0x38))(this->_listener,outputPath);
    }
  }
  return bVar2;
}

Assistant:

bool APNGAsm::saveJSON(const std::string& outputPath, const std::string& imageDir) const
  {
    bool result = false;
    if( _listener->onPreSave(outputPath) )
    {
      spec::SpecWriter writer(this, _listener);
      if( (result = writer.writeJSON(outputPath, imageDir)) )
        _listener->onPostSave(outputPath);
    }
    return result;
  }